

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMoves<(moira::Instr)132,(moira::Mode)6,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  char cVar7;
  uint uVar8;
  Rn rn;
  Ea<(moira::Mode)6,_1> ea;
  Ea<(moira::Mode)6,_1> local_44;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  Op<(moira::Mode)6,1>(&local_44,this,op & 7,addr);
  if (str->style->syntax != MUSASHI) {
    uVar8 = 0x1fe;
    if ((uVar4 & 0x7ff) != 0) {
      uVar8 = 0;
    }
    if ((uVar8 >> (this->dasmModel & 0x1f) & 1) == 0) {
      *addr = uVar1;
      dasmIllegal<(moira::Instr)132,(moira::Mode)6,1>(this,str,addr,op);
      return;
    }
  }
  rn.raw = (uVar4 & 0xffff) >> 0xc;
  cVar7 = 'm';
  lVar5 = 1;
  if (((uVar4 & 0xffff) >> 0xb & 1) == 0) {
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar7;
      cVar7 = "fdmoves"[lVar5 + 2];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    pcVar6 = str->ptr;
    SVar2 = str->style->syntax;
    str->ptr = pcVar6 + 1;
    if (2 < SVar2 - MOIRA_MIT) {
      *pcVar6 = '.';
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
    }
    *pcVar6 = 'b';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    else {
      iVar3 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar3);
    }
    StrWriter::operator<<(str,&local_44);
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    StrWriter::operator<<(str,rn);
  }
  else {
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar7;
      cVar7 = "fdmoves"[lVar5 + 2];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    pcVar6 = str->ptr;
    SVar2 = str->style->syntax;
    str->ptr = pcVar6 + 1;
    if (2 < SVar2 - MOIRA_MIT) {
      *pcVar6 = '.';
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
    }
    *pcVar6 = 'b';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    else {
      iVar3 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar3);
    }
    StrWriter::operator<<(str,rn);
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    StrWriter::operator<<(str,&local_44);
  }
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar7 = ';';
    lVar5 = 1;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar7;
      cVar7 = "bkpt    #%d; (1+)"[lVar5 + 0xb];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmMoves(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = (u16)dasmIncRead<Word>(addr);
    auto ea = Op <M,S> ( _____________xxx(op), addr );
    auto rg = Rn ( xxxx____________(ext) );

    if (str.style.syntax != Syntax::MUSASHI && !isAvailable(dasmModel, I, M, S, ext)) {

        addr = old;
        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    if (ext & 0x800) {      // Rg -> Ea
        str << Ins<I>{} << Sz<S>{} << str.tab << rg << Sep{} << ea;
    } else {                // Ea -> Rg
        str << Ins<I>{} << Sz<S>{} << str.tab << ea << Sep{} << rg;
    }
    str << Av<I, M, S>{};
}